

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl::commitFlips(Private_Impl *this)

{
  MMAL_STATUS_T MVar1;
  ostream *poVar2;
  long in_RDI;
  MMAL_PARAMETER_MIRROR_T mirror;
  MMAL_PARAMETER_HEADER_T local_14;
  uint local_c;
  
  local_14.id = 0x1000f;
  local_14.size = 0xc;
  if ((*(int *)(in_RDI + 0x94) == 0) || (*(int *)(in_RDI + 0x98) == 0)) {
    if (*(int *)(in_RDI + 0x94) == 0) {
      local_c = (uint)(*(int *)(in_RDI + 0x98) != 0);
    }
    else {
      local_c = 2;
    }
  }
  else {
    local_c = 3;
  }
  MVar1 = mmal_port_parameter_set
                    ((MMAL_PORT_T *)**(undefined8 **)(*(long *)(in_RDI + 0x18) + 0x40),&local_14);
  if (((MVar1 != MMAL_SUCCESS) ||
      (MVar1 = mmal_port_parameter_set
                         (*(MMAL_PORT_T **)(*(long *)(*(long *)(in_RDI + 0x18) + 0x40) + 8),
                          &local_14), MVar1 != MMAL_SUCCESS)) ||
     (MVar1 = mmal_port_parameter_set
                        (*(MMAL_PORT_T **)(*(long *)(*(long *)(in_RDI + 0x18) + 0x40) + 0x10),
                         &local_14), MVar1 != MMAL_SUCCESS)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"commitFlips");
    std::operator<<(poVar2,": Failed to set horizontal/vertical flip parameter.\n");
  }
  return;
}

Assistant:

void Private_Impl::commitFlips() {
            MMAL_PARAMETER_MIRROR_T mirror = {{MMAL_PARAMETER_MIRROR, sizeof ( MMAL_PARAMETER_MIRROR_T ) }, MMAL_PARAM_MIRROR_NONE};
            if ( State.hflip && State.vflip )
                mirror.value = MMAL_PARAM_MIRROR_BOTH;
            else if ( State.hflip )
                mirror.value = MMAL_PARAM_MIRROR_HORIZONTAL;
            else if ( State.vflip )
                mirror.value = MMAL_PARAM_MIRROR_VERTICAL;
            if ( mmal_port_parameter_set ( State.camera_component->output[0], &mirror.hdr ) != MMAL_SUCCESS ||
                    mmal_port_parameter_set ( State.camera_component->output[1], &mirror.hdr ) != MMAL_SUCCESS ||
                    mmal_port_parameter_set ( State.camera_component->output[2], &mirror.hdr ) )
                cout << __func__ << ": Failed to set horizontal/vertical flip parameter.\n";
        }